

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix.cc
# Opt level: O3

ColMatrix * __thiscall fizplex::ColMatrix::operator=(ColMatrix *this,ColMatrix *rhs)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  sVar1 = rhs->n;
  this->m = rhs->m;
  this->n = sVar1;
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::_M_erase_at_end
            (&this->cols,
             (this->cols).super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (this->n != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (rhs->n <= uVar2) {
        __assert_fail("i < n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix.cc"
                      ,0x14,"const SVector &fizplex::ColMatrix::column(size_t) const");
      }
      std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::push_back
                (&this->cols,
                 (value_type *)
                 ((long)&(((rhs->cols).
                           super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
                           _M_impl.super__Vector_impl_data._M_start)->values).
                         super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 + lVar3));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (uVar2 < this->n);
  }
  return this;
}

Assistant:

ColMatrix &ColMatrix::operator=(const ColMatrix &rhs) {
  m = rhs.m;
  n = rhs.n;
  cols.clear();
  for (size_t i = 0; i < n; i++)
    cols.push_back(rhs.column(i));
  return *this;
}